

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O1

void __thiscall Wasm::WasmBinaryReader::ReadExportSection(WasmBinaryReader *this)

{
  RealCount *pRVar1;
  SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount> *pSVar2;
  FunctionProxy *pFVar3;
  Type pWVar4;
  code *pcVar5;
  undefined8 uVar6;
  bool bVar7;
  ExternalKinds kind;
  uint uVar8;
  int iVar9;
  uint index;
  Type funcType;
  uint32 uVar10;
  uint uVar11;
  Type string1;
  Type *ppcVar12;
  Type pSVar13;
  WasmGlobal *pWVar14;
  WasmFunctionInfo *pWVar15;
  ulong count;
  WebAssemblyModule *this_00;
  WasmBinaryReader *pWVar16;
  WasmImport *pWVar17;
  undefined1 local_138 [8];
  ArenaAllocator tmpAlloc;
  BaseDictionary<unsigned_int,_SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  exportsNameDict;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  uint32 local_58 [2];
  uint32 length;
  NameList *list;
  uint local_3c;
  WebAssemblyModule *pWStack_38;
  uint32 nameLength;
  
  pWVar16 = this;
  uVar8 = LEB128<unsigned_int,32u>(this,local_58);
  local_58[1] = uVar8;
  if ((100000 < uVar8) && (DAT_015aa2e2 == '\0')) {
    ThrowDecodingError(pWVar16,L"Too many exports");
  }
  Js::WebAssemblyModule::AllocateFunctionExports(this->m_module,uVar8);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)local_138,
             L"ExportDupCheck",
             &(((((((this->m_module->super_DynamicObject).super_RecyclableObject.type.ptr)->
                  javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
               threadContext->pageAllocator).super_PageAllocator,Js::Throw::OutOfMemory,
             JsUtil::ExternalApi::RecoverUnusedMemory);
  tmpAlloc.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList =
       (void *)0x0;
  if (uVar8 != 0) {
    list = (NameList *)__tls_get_addr(&PTR_0155fe48);
    local_68._0_8_ = &DAT_015cd718;
    local_68._8_8_ = L"Unknown global %u for export %s";
    uVar8 = 0;
    pWStack_38 = (WebAssemblyModule *)this;
    do {
      string1 = (Type)ReadInlineName((WasmBinaryReader *)pWStack_38,local_58,&local_3c);
      _length = (SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
      bVar7 = JsUtil::
              BaseDictionary<unsigned_int,_SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::TryGetValue<unsigned_int>
                        ((BaseDictionary<unsigned_int,_SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                          *)&tmpAlloc.
                             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                             .freeList,&local_3c,
                         (SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount> **)&length);
      if (bVar7) {
        count = (ulong)local_3c;
        local_78._0_8_ = _length;
        local_78._8_8_ = _length;
        do {
          if ((SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount> *)local_78._8_8_ ==
              (SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *(undefined4 *)
             &(list->super_SListBase<const_char16_t_*,_Memory::ArenaAllocator,_RealCount>).
              super_SListNodeBase<Memory::ArenaAllocator>.next = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                               ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar7) goto LAB_00f25ec0;
            *(undefined4 *)
             &(list->super_SListBase<const_char16_t_*,_Memory::ArenaAllocator,_RealCount>).
              super_SListNodeBase<Memory::ArenaAllocator>.next = 0;
          }
          uVar6 = local_78._0_8_;
          pSVar2 = (SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount> *)
                   (((SListBase<const_char16_t_*,_Memory::ArenaAllocator,_RealCount> *)
                    local_78._8_8_)->super_SListNodeBase<Memory::ArenaAllocator>).next;
          local_78._8_8_ = (SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
          if (pSVar2 == (SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount> *)local_78._0_8_
             ) goto LAB_00f25b5a;
          local_78._8_8_ = pSVar2;
          ppcVar12 = SListBase<const_char16_t_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                               ((Iterator *)local_78);
          iVar9 = PAL_wcsncmp((char16_t *)string1,*ppcVar12,count);
        } while (iVar9 != 0);
        pWVar16 = (WasmBinaryReader *)local_78;
        SListBase<const_char16_t_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                  ((Iterator *)pWVar16);
        if (pSVar2 != (SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount> *)uVar6) {
          ThrowDecodingError(pWVar16,L"Duplicate export name: %s",string1);
        }
      }
      else {
        _length = (SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount> *)
                  new<Memory::ArenaAllocator>(0x18,(ArenaAllocator *)local_138,0x366bee);
        (_length->super_SListBase<const_char16_t_*,_Memory::ArenaAllocator,_RealCount>).
        super_RealCount.count = 0;
        (_length->super_SListBase<const_char16_t_*,_Memory::ArenaAllocator,_RealCount>).
        super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)_length;
        _length->allocator = (ArenaAllocator *)local_138;
        JsUtil::
        BaseDictionary<unsigned_int,SList<char16_t_const*,Memory::ArenaAllocator,RealCount>*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
        ::
        Insert<(JsUtil::BaseDictionary<unsigned_int,SList<char16_t_const*,Memory::ArenaAllocator,RealCount>*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                  ((BaseDictionary<unsigned_int,SList<char16_t_const*,Memory::ArenaAllocator,RealCount>*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                    *)&tmpAlloc.
                       super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                       freeList,&local_3c,
                   (SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount> **)&length);
      }
LAB_00f25b5a:
      pSVar2 = _length;
      pSVar13 = (Type)new<Memory::ArenaAllocator>(0x10,_length->allocator,0x366bee);
      this_00 = pWStack_38;
      pSVar13[1].next = string1;
      pSVar13->next =
           (pSVar2->super_SListBase<const_char16_t_*,_Memory::ArenaAllocator,_RealCount>).
           super_SListNodeBase<Memory::ArenaAllocator>.next;
      (pSVar2->super_SListBase<const_char16_t_*,_Memory::ArenaAllocator,_RealCount>).
      super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar13;
      pRVar1 = &(pSVar2->super_SListBase<const_char16_t_*,_Memory::ArenaAllocator,_RealCount>).
                super_RealCount;
      pRVar1->count = pRVar1->count + 1;
      kind = ReadConst<unsigned_char>((WasmBinaryReader *)pWStack_38);
      index = LEB128<unsigned_int,32u>((WasmBinaryReader *)this_00,local_58);
      switch(kind) {
      case Function:
        funcType = Js::WebAssemblyModule::GetFunctionIndexType
                             ((WebAssemblyModule *)(pWStack_38->m_datasegs).ptr,index);
        pWVar16 = (WasmBinaryReader *)(ulong)(uint)funcType;
        bVar7 = FunctionIndexTypes::CanBeExported(funcType);
        if (!bVar7) {
          ThrowDecodingError(pWVar16,L"Invalid Export %u => func[%u]",(ulong)uVar8,(ulong)index);
        }
        Js::WebAssemblyModule::SetExport
                  ((WebAssemblyModule *)(pWStack_38->m_datasegs).ptr,uVar8,index,(char16 *)string1,
                   local_3c,Function);
        if (funcType == ImportThunk) {
          pWVar15 = Js::WebAssemblyModule::GetWasmFunctionInfo
                              ((WebAssemblyModule *)(pWStack_38->m_datasegs).ptr,index);
          pWVar4 = pWVar15->importedFunctionReference;
          pFVar3 = (FunctionProxy *)(pWStack_38->m_memImport).ptr;
          if (pFVar3 == (FunctionProxy *)0x0 || pWStack_38->m_importedFunctionCount != 1) {
            bVar7 = Js::Phases::IsEnabled((Phases *)local_68._0_8_,WasmReaderPhase);
          }
          else {
            uVar11 = Js::FunctionProxy::GetSourceContextId(pFVar3);
            if (pWStack_38->m_importedFunctionCount == 1) {
              pWVar17 = (pWStack_38->m_memImport).ptr;
            }
            else {
              pWVar17 = (WasmImport *)0x0;
            }
            if (*(long *)&pWVar17->importNameLen == 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *(undefined4 *)
               &(list->super_SListBase<const_char16_t_*,_Memory::ArenaAllocator,_RealCount>).
                super_SListNodeBase<Memory::ArenaAllocator>.next = 1;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/../Runtime/Base/FunctionBody.h"
                                 ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
              if (!bVar7) goto LAB_00f25ec0;
              *(undefined4 *)
               &(list->super_SListBase<const_char16_t_*,_Memory::ArenaAllocator,_RealCount>).
                super_SListNodeBase<Memory::ArenaAllocator>.next = 0;
            }
            bVar7 = Js::Phases::IsEnabled
                              ((Phases *)local_68._0_8_,WasmReaderPhase,uVar11,
                               *(LocalFunctionId *)(*(long *)&pWVar17->importNameLen + 0x10));
          }
          if (bVar7 != false) {
            Output::Print(L"Export #%u: Import(%s.%s)(%u) => %s",(ulong)uVar8,pWVar4->modName,
                          pWVar4->importName,(ulong)index);
            Output::Print(L"\n");
            Output::Flush();
          }
        }
        else {
          pFVar3 = (FunctionProxy *)(pWStack_38->m_memImport).ptr;
          if (pFVar3 == (FunctionProxy *)0x0 || pWStack_38->m_importedFunctionCount != 1) {
            bVar7 = Js::Phases::IsEnabled((Phases *)local_68._0_8_,WasmReaderPhase);
          }
          else {
            uVar11 = Js::FunctionProxy::GetSourceContextId(pFVar3);
            if (pWStack_38->m_importedFunctionCount == 1) {
              pWVar17 = (pWStack_38->m_memImport).ptr;
            }
            else {
              pWVar17 = (WasmImport *)0x0;
            }
            if (*(long *)&pWVar17->importNameLen == 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *(undefined4 *)
               &(list->super_SListBase<const_char16_t_*,_Memory::ArenaAllocator,_RealCount>).
                super_SListNodeBase<Memory::ArenaAllocator>.next = 1;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/../Runtime/Base/FunctionBody.h"
                                 ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
              if (!bVar7) {
LAB_00f25ec0:
                pcVar5 = (code *)invalidInstructionException();
                (*pcVar5)();
              }
              *(undefined4 *)
               &(list->super_SListBase<const_char16_t_*,_Memory::ArenaAllocator,_RealCount>).
                super_SListNodeBase<Memory::ArenaAllocator>.next = 0;
            }
            bVar7 = Js::Phases::IsEnabled
                              ((Phases *)local_68._0_8_,WasmReaderPhase,uVar11,
                               *(LocalFunctionId *)(*(long *)&pWVar17->importNameLen + 0x10));
          }
          if (bVar7 != false) {
            Output::Print(L"Export #%u: Function(%u) => %s",(ulong)uVar8,(ulong)index,string1);
            Output::Print(L"\n");
            Output::Flush();
          }
        }
        goto LAB_00f25caa;
      case Table:
        if (index != 0) {
          local_68._8_8_ = L"Unknown table index %u for export %s";
          goto LAB_00f25ef3;
        }
        break;
      case Memory:
        if (index != 0) {
          local_68._8_8_ = L"Unknown memory index %u for export %s";
          goto LAB_00f25ef3;
        }
        break;
      case Global:
        this_00 = (WebAssemblyModule *)(pWStack_38->m_datasegs).ptr;
        uVar10 = Js::WebAssemblyModule::GetGlobalCount(this_00);
        if (uVar10 <= index) {
LAB_00f25ef3:
          ThrowDecodingError((WasmBinaryReader *)this_00,(char16 *)local_68._8_8_,(ulong)index,
                             string1);
        }
        this_00 = (WebAssemblyModule *)(pWStack_38->m_datasegs).ptr;
        pWVar14 = Js::WebAssemblyModule::GetGlobal(this_00,index);
        if (pWVar14->m_isMutable != false) {
          local_68._8_8_ = L"Mutable globals cannot be exported";
          goto LAB_00f25ef3;
        }
        goto LAB_00f25c8a;
      default:
        ThrowDecodingError((WasmBinaryReader *)this_00,L"Exported Kind %d, NYI",(ulong)kind);
      }
      index = 0;
LAB_00f25c8a:
      Js::WebAssemblyModule::SetExport
                ((WebAssemblyModule *)(pWStack_38->m_datasegs).ptr,uVar8,index,(char16 *)string1,
                 local_3c,kind);
LAB_00f25caa:
      uVar8 = uVar8 + 1;
    } while (uVar8 != local_58[1]);
  }
  JsUtil::
  BaseDictionary<unsigned_int,_SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary((BaseDictionary<unsigned_int,_SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     *)&tmpAlloc.
                        super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                        freeList);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)local_138);
  return;
}

Assistant:

void WasmBinaryReader::ReadExportSection()
{
    uint32 length;
    uint32 numExports = LEB128(length);
    if (numExports > Limits::GetMaxExports())
    {
        ThrowDecodingError(_u("Too many exports"));
    }

    m_module->AllocateFunctionExports(numExports);

    ArenaAllocator tmpAlloc(_u("ExportDupCheck"), m_module->GetScriptContext()->GetThreadContext()->GetPageAllocator(), Js::Throw::OutOfMemory);
    typedef SList<const char16*> NameList;
    JsUtil::BaseDictionary<uint32, NameList*, ArenaAllocator> exportsNameDict(&tmpAlloc);

    for (uint32 iExport = 0; iExport < numExports; iExport++)
    {
        uint32 nameLength;
        const char16* exportName = ReadInlineName(length, nameLength);

        // Check if the name is already used
        NameList* list = nullptr;
        if (exportsNameDict.TryGetValue(nameLength, &list))
        {
            const char16** found = list->Find([exportName, nameLength](const char16* existing) { 
                return wcsncmp(exportName, existing, nameLength) == 0;
            });
            if (found)
            {
                ThrowDecodingError(_u("Duplicate export name: %s"), exportName);
            }
        }
        else
        {
            list = Anew(&tmpAlloc, NameList, &tmpAlloc);
            exportsNameDict.Add(nameLength, list);
        }
        list->Push(exportName);

        ExternalKinds kind = ReadExternalKind();
        uint32 index = LEB128(length);
        switch (kind)
        {
        case ExternalKinds::Function:
        {
            FunctionIndexTypes::Type type = m_module->GetFunctionIndexType(index);
            if (!FunctionIndexTypes::CanBeExported(type))
            {
                ThrowDecodingError(_u("Invalid Export %u => func[%u]"), iExport, index);
            }
            m_module->SetExport(iExport, index, exportName, nameLength, kind);

#if DBG_DUMP
            if (type == FunctionIndexTypes::ImportThunk)
            {
                WasmImport* import = m_module->GetWasmFunctionInfo(index)->importedFunctionReference;
                TRACE_WASM_DECODER(_u("Export #%u: Import(%s.%s)(%u) => %s"), iExport, import->modName, import->importName, index, exportName);
            }
            else
            {
                TRACE_WASM_DECODER(_u("Export #%u: Function(%u) => %s"), iExport, index, exportName);
            }
#endif
            break;
        }
        case ExternalKinds::Memory:
            if (index != 0)
            {
                ThrowDecodingError(_u("Unknown memory index %u for export %s"), index, exportName);
            }
            m_module->SetExport(iExport, index, exportName, nameLength, kind);
            break;
        case ExternalKinds::Table:
            if (index != 0)
            {
                ThrowDecodingError(_u("Unknown table index %u for export %s"), index, exportName);
            }
            m_module->SetExport(iExport, index, exportName, nameLength, kind);
            break;
        case ExternalKinds::Global:
            if (index >= m_module->GetGlobalCount())
            {
                ThrowDecodingError(_u("Unknown global %u for export %s"), index, exportName);
            }
            if (m_module->GetGlobal(index)->IsMutable())
            {
                ThrowDecodingError(_u("Mutable globals cannot be exported"), index, exportName);
            }
            m_module->SetExport(iExport, index, exportName, nameLength, kind);
            break;
        default:
            ThrowDecodingError(_u("Exported Kind %d, NYI"), kind);
            break;
        }

    }
}